

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O2

double rotationMatrixFromContactsPositionKine(Vector3 *vLFootPos,Vector3 *vRFootPos,Matrix3 *R)

{
  double __x;
  double __x_00;
  double dVar1;
  double dVar2;
  Index IVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar4;
  double local_e8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_c8;
  double local_a8;
  double local_a0;
  double local_98;
  Scalar local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  Vector3 axis;
  Vector3 Vrl;
  AngleAxis j;
  
  local_c8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)vLFootPos;
  local_c8.m_row = (Index)vRFootPos;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&Vrl,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                   *)&local_c8);
  stateObservation::kine::rotationVectorToAngleAxis((AngleAxis *)&local_c8,&Vrl);
  IVar3 = local_c8.m_currentBlockRows;
  j.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)local_c8.m_col;
  j.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)local_c8.m_xpr;
  j.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)local_c8.m_row;
  j.m_angle = (Scalar)local_c8.m_currentBlockRows;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&axis,&j.m_axis);
  atan2(axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1],
        axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2])
  ;
  __x = atan2(axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0],axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2]);
  __x_00 = atan2(axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0],axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1]);
  dVar1 = cos(__x);
  dVar2 = cos(__x_00);
  local_c8.m_row = 0;
  local_c8.m_col = 1;
  local_c8.m_currentBlockRows = 1;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar2 * dVar1;
  local_c8.m_xpr = R;
  local_e8 = cos(__x);
  local_e8 = -local_e8;
  local_70 = sin(__x_00);
  local_70 = local_70 * local_e8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_c8,&local_70);
  local_78 = sin(__x);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_78);
  local_80 = sin(__x_00);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_80);
  local_88 = cos(__x_00);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_88);
  local_90 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_90);
  local_e8 = sin(__x);
  local_e8 = -local_e8;
  local_98 = cos(__x_00);
  local_98 = local_98 * local_e8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_98);
  dVar1 = sin(__x);
  local_a0 = sin(__x_00);
  local_a0 = local_a0 * dVar1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_a0);
  local_a8 = cos(__x);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_c8);
  return (double)IVar3;
}

Assistant:

double rotationMatrixFromContactsPositionKine(const Vector3 vLFootPos, const Vector3 vRFootPos, Matrix3& R )
{
Vector3 Vrl, axis, theta;
AngleAxis j;
double h, thetax, thetay, thetaz;
// Definition of the length and the unit vector between the two foots.
Vrl=vLFootPos-vRFootPos;
j=kine::rotationVectorToAngleAxis(Vrl);
h = j.angle(); // length between the ankles
axis = j.axis(); // unit vector between the ankles
//Definition of the transformation (rotation) between (x,y,z) and (perpendicular of j, j, z).
thetax=atan2(axis[1],axis[2]);
//theta=theta(0,0,atan(axis[0]/axis[1]));
thetay = atan2(axis[0],axis[2]);//theta[1];
thetaz = atan2(axis[0],axis[1]);//theta[2];
R << cos(thetay)*cos(thetaz), -cos(thetay)*sin(thetaz), sin(thetay),
sin(thetaz), cos(thetaz), 0,
-sin(thetay)*cos(thetaz), sin(thetay)*sin(thetaz), cos(thetay);
return h;
}